

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwttests.c
# Opt level: O3

int main(void)

{
  int iVar1;
  wave_object obj;
  FILE *__stream;
  double *inp;
  double *oup;
  void *__ptr;
  wt_object wt;
  long lVar2;
  undefined1 *puVar3;
  long lVar4;
  undefined1 local_25c8 [8];
  double temp [1200];
  
  obj = wave_init("db4");
  wave_summary(obj);
  __stream = fopen("../data/signal.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot Open File");
    exit(100);
  }
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    puVar3 = local_25c8;
    do {
      __isoc99_fscanf(__stream,"%lf \n",puVar3);
      iVar1 = feof(__stream);
      puVar3 = puVar3 + 8;
    } while (iVar1 == 0);
  }
  fclose(__stream);
  inp = (double *)malloc(0x588);
  oup = (double *)malloc(0x588);
  __ptr = malloc(0x588);
  memcpy(inp,local_25c8,0x588);
  wt = wt_init(obj,"modwt",0xb1,2);
  modwt(wt,inp);
  if (0 < wt->outlength) {
    lVar4 = 0;
    do {
      printf("%g ",wt->output[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < wt->outlength);
  }
  imodwt(wt,oup);
  iVar1 = wt->siglength;
  lVar4 = (long)iVar1;
  if (0 < lVar4) {
    lVar2 = 0;
    do {
      *(double *)((long)__ptr + lVar2 * 8) = oup[lVar2] - inp[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar4 != lVar2);
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        lVar2 = lVar2 + 1;
      } while (lVar4 != lVar2);
    }
  }
  printf("\n MAX %g \n");
  wt_summary(wt);
  wave_free(obj);
  wt_free(wt);
  free(inp);
  free(oup);
  free(__ptr);
  return 0;
}

Assistant:

int main() {
	wave_object obj;
	wt_object wt;
	double *inp, *out, *diff;
	int N, i, J;

	FILE *ifp;
	double temp[1200];

	char *name = "db4";
	obj = wave_init(name);
	wave_summary(obj);

	ifp = fopen("../data/signal.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = 177;
	
	fclose(ifp);

	inp = (double*)malloc(sizeof(double)* N);
	out = (double*)malloc(sizeof(double)* N);
	diff = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}
	J = 2;

	wt = wt_init(obj, "modwt", N, J);// Initialize the wavelet transform object
	
	modwt(wt, inp);// Perform MODWT
	//MODWT output can be accessed using wt->output vector. Use wt_summary to find out how to extract appx and detail coefficients
	
	for (i = 0; i < wt->outlength; ++i) {
		printf("%g ",wt->output[i]);
	}

	imodwt(wt, out);// Perform ISWT (if needed)
	// Test Reconstruction


	for (i = 0; i < wt->siglength; ++i) {
		diff[i] = out[i] - inp[i];
	}

	printf("\n MAX %g \n", absmax(diff, wt->siglength));// If Reconstruction succeeded then the output should be a small value.
	
	wt_summary(wt);// Prints the full summary.

	wave_free(obj);
	wt_free(wt);

	free(inp);
	free(out);
	free(diff);
	return 0;
}